

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

int __thiscall
duckdb::Interpolator<true>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
          (Interpolator<true> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  RESULT_TYPE_conflict1 input;
  int iVar1;
  unsigned_long local_8;
  
  local_8 = lidx;
  input = QuantileIndirect<int>::operator()(accessor,&local_8);
  iVar1 = Cast::Operation<int,int>(input);
  return iVar1;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
	}